

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManifestLoader.cpp
# Opt level: O3

void __thiscall
llbuild::ninja::ManifestLoader::ManifestLoaderImpl::evalString
          (ManifestLoaderImpl *this,void *userContext,StringRef string,raw_ostream *result,
          function<void_(void_*,_llvm::StringRef,_llvm::raw_ostream_&)> *lookup,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *error)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  raw_ostream *prVar7;
  bool bVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__buf;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_07;
  char *pcVar9;
  size_t sVar10;
  uint __fd;
  char *pcVar11;
  byte *pbVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  StringRef Str;
  StringRef Str_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  void *local_48;
  _Any_data *local_40;
  void *local_38;
  
  prVar7 = (raw_ostream *)string.Length;
  __buf = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)string.Data;
  if (prVar7 != (raw_ostream *)0x0) {
    pbVar12 = (byte *)(__buf->_M_local_buf + (long)&prVar7->_vptr_raw_ostream);
    paVar13 = __buf;
    local_40 = (_Any_data *)lookup;
    local_38 = userContext;
    do {
      sVar10 = 0;
      while (paVar13->_M_local_buf[sVar10] != 0x24) {
        lVar3 = sVar10 + 1;
        sVar10 = sVar10 + 1;
        if ((byte *)(paVar13->_M_local_buf + lVar3) == pbVar12) {
          Str_00.Length = sVar10;
          Str_00.Data = (char *)paVar13;
          llvm::raw_ostream::operator<<(result,Str_00);
          return;
        }
      }
      if (sVar10 != 0) {
        Str.Length = sVar10;
        Str.Data = (char *)paVar13;
        llvm::raw_ostream::operator<<(result,Str);
        __buf = extraout_RDX;
      }
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(paVar13->_M_local_buf + sVar10 + 1);
      if (paVar6 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pbVar12) {
        pcVar11 = "invalid \'$\'-escape at end of string";
        pcVar9 = "";
LAB_00132a51:
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,pcVar11,pcVar9);
        if ((error->super__Function_base)._M_manager != (_Manager_type)0x0) {
          (*error->_M_invoker)((_Any_data *)error,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p == &local_68.field_2) {
            return;
          }
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          return;
        }
LAB_00132a9d:
        std::__throw_bad_function_call();
      }
      bVar1 = paVar6->_M_local_buf[0];
      prVar7 = (raw_ostream *)CONCAT71((int7)((ulong)prVar7 >> 8),bVar1);
      __fd = (uint)bVar1;
      if (bVar1 < 0x24) {
        if (bVar1 != 10) {
          if (__fd != 0x20) goto LAB_00132892;
          goto LAB_0013283f;
        }
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar13->_M_local_buf + sVar10 + 2);
        while ((paVar13 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pbVar12 &&
               (iVar5 = isspace((int)paVar13->_M_local_buf[0]), __buf = extraout_RDX_01, iVar5 != 0)
               )) {
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar13->_M_local_buf + 1);
        }
      }
      else if ((__fd == 0x24) || (bVar1 == 0x3a)) {
LAB_0013283f:
        pbVar2 = (byte *)result->OutBufCur;
        if (pbVar2 < result->OutBufEnd) {
          __buf = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar2 + 1);
          result->OutBufCur = (char *)__buf;
          *pbVar2 = bVar1;
        }
        else {
          llvm::raw_ostream::write(result,__fd,__buf,(size_t)prVar7);
          __buf = extraout_RDX_00;
        }
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar13->_M_local_buf + sVar10 + 2);
      }
      else if (bVar1 == 0x7b) {
        local_68._M_dataplus._M_p = paVar13->_M_local_buf + sVar10 + 2;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p;
        if ((byte *)local_68._M_dataplus._M_p != pbVar12) {
          bVar8 = true;
          prVar7 = (raw_ostream *)0x0;
          do {
            bVar1 = paVar13->_M_local_buf[0];
            if (bVar1 == 0x7d) {
              if (bVar8) {
                local_48 = local_38;
                local_68._M_string_length = (size_type)prVar7;
                if (*(long *)(local_40 + 1) == 0) goto LAB_00132a9d;
                prVar7 = result;
                (**(code **)(local_40->_M_pod_data + 0x18))
                          (local_40,&local_48,(StringRef *)&local_68,result);
                __buf = extraout_RDX_05;
              }
              else {
                local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_68,"invalid variable name in reference","");
                if ((error->super__Function_base)._M_manager == (_Manager_type)0x0)
                goto LAB_00132a9d;
                (*error->_M_invoker)((_Any_data *)error,&local_68);
                __buf = extraout_RDX_06;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p != &local_68.field_2) {
                  operator_delete(local_68._M_dataplus._M_p,
                                  local_68.field_2._M_allocated_capacity + 1);
                  __buf = extraout_RDX_07;
                }
              }
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar13->_M_local_buf + 1);
              goto LAB_00132a0d;
            }
            if (((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
LAB_00132821:
              bVar4 = bVar8;
            }
            else {
              bVar4 = false;
              if ((bVar1 - 0x2d < 0x33) &&
                 ((0x4000000000003U >> ((ulong)(bVar1 - 0x2d) & 0x3f) & 1) != 0)) goto LAB_00132821;
            }
            bVar8 = bVar4;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar13->_M_local_buf + 1);
            prVar7 = (raw_ostream *)((long)&prVar7->_vptr_raw_ostream + 1);
          } while (paVar13 !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)pbVar12);
        }
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,
                   "invalid variable reference in string (missing trailing \'}\')","");
        if ((error->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00132a9d;
        (*error->_M_invoker)((_Any_data *)error,&local_68);
        __buf = extraout_RDX_03;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          __buf = extraout_RDX_04;
        }
      }
      else {
LAB_00132892:
        if ((((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
            (__fd != 0x5f)) && (bVar1 != 0x2d)) {
          pcVar11 = "invalid \'$\'-escape (literal \'$\' should be written as \'$$\')";
          pcVar9 = "";
          goto LAB_00132a51;
        }
        for (paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(paVar13->_M_local_buf + sVar10 + 2);
            (paVar14 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pbVar12 &&
            (((bVar1 = paVar14->_M_local_buf[0], (byte)(bVar1 - 0x30) < 10 ||
              ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) || ((bVar1 == 0x5f || (bVar1 == 0x2d))))));
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar14->_M_local_buf + 1)) {
        }
        local_68._M_string_length = (size_type)(paVar14->_M_local_buf + (~(ulong)paVar13 - sVar10));
        local_48 = local_38;
        local_68._M_dataplus._M_p = (pointer)paVar6;
        if (*(long *)(local_40 + 1) == 0) goto LAB_00132a9d;
        prVar7 = result;
        (**(code **)(local_40->_M_pod_data + 0x18))
                  (local_40,&local_48,(StringRef *)&local_68,result);
        __buf = extraout_RDX_02;
        paVar13 = paVar14;
      }
LAB_00132a0d:
    } while (paVar13 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pbVar12);
  }
  return;
}

Assistant:

void evalString(void* userContext, StringRef string, raw_ostream& result,
                  std::function<void(void*, StringRef, raw_ostream&)> lookup,
                  std::function<void(const std::string&)> error) {
    // Scan the string for escape sequences or variable references, accumulating
    // output pieces as we go.
    const char* pos = string.begin();
    const char* end = string.end();
    while (pos != end) {
      // Find the next '$'.
      const char* pieceStart = pos;
      for (; pos != end; ++pos) {
        if (*pos == '$')
          break;
      }

      // Add the current piece, if non-empty.
      if (pos != pieceStart)
        result << StringRef(pieceStart, pos - pieceStart);

      // If we are at the end, we are done.
      if (pos == end)
        break;

      // Otherwise, we have a '$' character to handle.
      ++pos;
      if (pos == end) {
        error("invalid '$'-escape at end of string");
        break;
      }

      // If this is a newline continuation, skip it and all leading space.
      int c = *pos;
      if (c == '\n') {
        ++pos;
        while (pos != end && isspace(*pos))
          ++pos;
        continue;
      }

      // If this is single character escape, honor it.
      if (c == ' ' || c == ':' || c == '$') {
        result << char(c);
        ++pos;
        continue;
      }

      // If this is a braced variable reference, expand it.
      if (c == '{') {
        // Scan until the end of the reference, checking validity of the
        // identifier name as we go.
        ++pos;
        const char* varStart = pos;
        bool isValid = true;
        while (true) {
          // If we reached the end of the string, this is an error.
          if (pos == end) {
            error(
                "invalid variable reference in string (missing trailing '}')");
            break;
          }

          // If we found the end of the reference, resolve it.
          int c = *pos;
          if (c == '}') {
            // If this identifier isn't valid, emit an error.
            if (!isValid) {
              error("invalid variable name in reference");
            } else {
              lookup(userContext, StringRef(varStart, pos - varStart),
                     result);
            }
            ++pos;
            break;
          }

          // Track whether this is a valid identifier.
          if (!Lexer::isIdentifierChar(c))
            isValid = false;

          ++pos;
        }
        continue;
      }

      // If this is a simple variable reference, expand it.
      if (Lexer::isSimpleIdentifierChar(c)) {
        const char* varStart = pos;
        // Scan until the end of the simple identifier.
        ++pos;
        while (pos != end && Lexer::isSimpleIdentifierChar(*pos))
          ++pos;
        lookup(userContext, StringRef(varStart, pos-varStart), result);
        continue;
      }

      // Otherwise, we have an invalid '$' escape.
      error("invalid '$'-escape (literal '$' should be written as '$$')");
      break;
    }
  }